

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cc
# Opt level: O3

bool __thiscall
FileTest::GetInstructionBytes
          (FileTest *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *key)

{
  bool bVar1;
  string value;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = GetInstruction(this,&local_38,key);
  if (bVar1) {
    bVar1 = ConvertToBytes(this,out,&local_38);
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool FileTest::GetInstructionBytes(std::vector<uint8_t> *out,
                                   const std::string &key) {
  std::string value;
  return GetInstruction(&value, key) && ConvertToBytes(out, value);
}